

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::is2DTrilinearFilterResultValid
               (LookupPrecision *prec,ColorQuad *quad0,ColorQuad *quad1,Vec2 *xBounds0,
               Vec2 *yBounds0,Vec2 *xBounds1,Vec2 *yBounds1,Vec2 *zBounds,float searchStep,
               Vec4 *result)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int i;
  long lVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Vector<float,_4> res_8;
  Vector<float,_4> res_9;
  Vector<float,_4> res_5;
  Vector<float,_4> res_6;
  Vector<float,_4> res_2;
  Vector<float,_4> res_3;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  Vector<float,_4> res_4;
  Vector<float,_4> res_7;
  Vector<float,_4> res_19;
  Vec4 c0;
  float local_188 [36];
  Vec4 local_f8;
  Vec2 *local_e8;
  Vec2 *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  Vec2 *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78 [4];
  Vec4 local_68;
  float local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_e0 = yBounds0;
  local_a0 = xBounds1;
  bVar5 = isInColorBounds(prec,quad0,quad1,result);
  if (bVar5) {
    fVar10 = xBounds0->m_data[0];
    local_d8 = ZEXT416((uint)fVar10);
    fVar9 = xBounds0->m_data[1] + searchStep;
    bVar5 = fVar10 < fVar9;
    if (fVar10 < fVar9) {
      local_e8 = xBounds0;
      do {
        fVar10 = local_e0->m_data[0];
        local_c8 = ZEXT416((uint)fVar10);
        fVar9 = local_e0->m_data[1];
        bVar4 = fVar9 + searchStep <= fVar10;
        if (fVar10 < fVar9 + searchStep) {
          do {
            uVar8 = -(uint)((float)local_d8._0_4_ <= xBounds0->m_data[1]);
            fVar10 = (float)(~uVar8 & (uint)xBounds0->m_data[1] | uVar8 & local_d8._0_4_);
            local_188[0x18] = 0.0;
            local_188[0x19] = 0.0;
            local_188[0x1a] = 0.0;
            local_188[0x1b] = 0.0;
            lVar7 = 0;
            do {
              local_188[lVar7 + 0x18] = (quad0->p00).m_data[lVar7] * (1.0 - fVar10);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            fVar9 = (float)(~-(uint)((float)local_c8._0_4_ <= fVar9) & (uint)fVar9 |
                           -(uint)((float)local_c8._0_4_ <= fVar9) & local_c8._0_4_);
            local_188[0x1c] = 0.0;
            local_188[0x1d] = 0.0;
            local_188[0x1e] = 0.0;
            local_188[0x1f] = 0.0;
            lVar7 = 0;
            do {
              local_188[lVar7 + 0x1c] = local_188[lVar7 + 0x18] * (1.0 - fVar9);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            local_188[0x10] = 0.0;
            local_188[0x11] = 0.0;
            local_188[0x12] = 0.0;
            local_188[0x13] = 0.0;
            lVar7 = 0;
            do {
              local_188[lVar7 + 0x10] = (quad0->p10).m_data[lVar7] * fVar10;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            local_188[0x14] = 0.0;
            local_188[0x15] = 0.0;
            local_188[0x16] = 0.0;
            local_188[0x17] = 0.0;
            lVar7 = 0;
            do {
              local_188[lVar7 + 0x14] = local_188[lVar7 + 0x10] * (1.0 - fVar9);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            local_188[0x20] = 0.0;
            local_188[0x21] = 0.0;
            local_188[0x22] = 0.0;
            local_188[0x23] = 0.0;
            lVar7 = 0;
            do {
              local_188[lVar7 + 0x20] = local_188[lVar7 + 0x1c] + local_188[lVar7 + 0x14];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            local_188[8] = 0.0;
            local_188[9] = 0.0;
            local_188[10] = 0.0;
            local_188[0xb] = 0.0;
            lVar7 = 0;
            do {
              local_188[lVar7 + 8] = (quad0->p01).m_data[lVar7] * (1.0 - fVar10);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            local_188[0xc] = 0.0;
            local_188[0xd] = 0.0;
            local_188[0xe] = 0.0;
            local_188[0xf] = 0.0;
            lVar7 = 0;
            do {
              local_188[lVar7 + 0xc] = local_188[lVar7 + 8] * fVar9;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            local_f8.m_data[0] = 0.0;
            local_f8.m_data[1] = 0.0;
            local_f8.m_data[2] = 0.0;
            local_f8.m_data[3] = 0.0;
            lVar7 = 0;
            do {
              local_f8.m_data[lVar7] = local_188[lVar7 + 0x20] + local_188[lVar7 + 0xc];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            local_188[0] = 0.0;
            local_188[1] = 0.0;
            local_188[2] = 0.0;
            local_188[3] = 0.0;
            lVar7 = 0;
            do {
              local_188[lVar7] = (quad0->p11).m_data[lVar7] * fVar10;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            local_188[4] = 0.0;
            local_188[5] = 0.0;
            local_188[6] = 0.0;
            local_188[7] = 0.0;
            lVar7 = 0;
            do {
              local_188[lVar7 + 4] = local_188[lVar7] * fVar9;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            local_68.m_data[0] = 0.0;
            local_68.m_data[1] = 0.0;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 0.0;
            lVar7 = 0;
            do {
              local_68.m_data[lVar7] = local_f8.m_data[lVar7] + local_188[lVar7 + 4];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 4);
            local_b8 = ZEXT416((uint)local_a0->m_data[0]);
            local_98 = ZEXT416((uint)local_a0->m_data[1]);
            bVar1 = local_a0->m_data[1] < local_a0->m_data[0];
            if (!bVar1) {
              fVar10 = yBounds1->m_data[0];
              fVar9 = yBounds1->m_data[1];
              bVar2 = fVar9 < fVar10;
              local_88 = ZEXT416((uint)fVar9);
              do {
                if (fVar10 <= fVar9) {
                  local_58 = (float)(~-(uint)((float)local_b8._0_4_ <= (float)local_98._0_4_) &
                                     local_98._0_4_ |
                                    -(uint)((float)local_b8._0_4_ <= (float)local_98._0_4_) &
                                    local_b8._0_4_);
                  uStack_54 = ~local_b8._4_4_ & local_98._4_4_ | local_b8._4_4_;
                  uStack_50 = ~local_b8._8_4_ & local_98._8_4_ | local_b8._8_4_;
                  uStack_4c = ~local_b8._12_4_ & local_98._12_4_ | local_b8._12_4_;
                  fVar11 = 1.0 - local_58;
                  uStack_44 = 0;
                  uStack_40 = 0;
                  uStack_3c = 0;
                  local_48 = fVar10;
                  bVar3 = bVar2;
                  do {
                    local_188[0x14] = 0.0;
                    local_188[0x15] = 0.0;
                    local_188[0x16] = 0.0;
                    local_188[0x17] = 0.0;
                    lVar7 = 0;
                    do {
                      local_188[lVar7 + 0x14] = (quad1->p00).m_data[lVar7] * fVar11;
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 4);
                    fVar9 = (float)(~-(uint)(local_48 <= fVar9) & (uint)fVar9 |
                                   -(uint)(local_48 <= fVar9) & (uint)local_48);
                    local_188[0x18] = 0.0;
                    local_188[0x19] = 0.0;
                    local_188[0x1a] = 0.0;
                    local_188[0x1b] = 0.0;
                    lVar7 = 0;
                    do {
                      local_188[lVar7 + 0x18] = local_188[lVar7 + 0x14] * (1.0 - fVar9);
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 4);
                    local_188[0xc] = 0.0;
                    local_188[0xd] = 0.0;
                    local_188[0xe] = 0.0;
                    local_188[0xf] = 0.0;
                    lVar7 = 0;
                    do {
                      local_188[lVar7 + 0xc] = (quad1->p10).m_data[lVar7] * local_58;
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 4);
                    local_188[0x10] = 0.0;
                    local_188[0x11] = 0.0;
                    local_188[0x12] = 0.0;
                    local_188[0x13] = 0.0;
                    lVar7 = 0;
                    do {
                      local_188[lVar7 + 0x10] = local_188[lVar7 + 0xc] * (1.0 - fVar9);
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 4);
                    local_188[0x1c] = 0.0;
                    local_188[0x1d] = 0.0;
                    local_188[0x1e] = 0.0;
                    local_188[0x1f] = 0.0;
                    lVar7 = 0;
                    do {
                      local_188[lVar7 + 0x1c] = local_188[lVar7 + 0x18] + local_188[lVar7 + 0x10];
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 4);
                    local_188[4] = 0.0;
                    local_188[5] = 0.0;
                    local_188[6] = 0.0;
                    local_188[7] = 0.0;
                    lVar7 = 0;
                    do {
                      local_188[lVar7 + 4] = (quad1->p01).m_data[lVar7] * fVar11;
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 4);
                    local_188[8] = 0.0;
                    local_188[9] = 0.0;
                    local_188[10] = 0.0;
                    local_188[0xb] = 0.0;
                    lVar7 = 0;
                    do {
                      local_188[lVar7 + 8] = local_188[lVar7 + 4] * fVar9;
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 4);
                    local_188[0x20] = 0.0;
                    local_188[0x21] = 0.0;
                    local_188[0x22] = 0.0;
                    local_188[0x23] = 0.0;
                    lVar7 = 0;
                    do {
                      local_188[lVar7 + 0x20] = local_188[lVar7 + 0x1c] + local_188[lVar7 + 8];
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 4);
                    local_78[0] = 0.0;
                    local_78[1] = 0.0;
                    local_78[2] = 0.0;
                    local_78[3] = 0.0;
                    lVar7 = 0;
                    do {
                      local_78[lVar7] = (quad1->p11).m_data[lVar7] * local_58;
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 4);
                    local_188[0] = 0.0;
                    local_188[1] = 0.0;
                    local_188[2] = 0.0;
                    local_188[3] = 0.0;
                    lVar7 = 0;
                    do {
                      local_188[lVar7] = local_78[lVar7] * fVar9;
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 4);
                    local_f8.m_data[0] = 0.0;
                    local_f8.m_data[1] = 0.0;
                    local_f8.m_data[2] = 0.0;
                    local_f8.m_data[3] = 0.0;
                    lVar7 = 0;
                    do {
                      local_f8.m_data[lVar7] = local_188[lVar7 + 0x20] + local_188[lVar7];
                      lVar7 = lVar7 + 1;
                    } while (lVar7 != 4);
                    bVar6 = isLinearRangeValid(prec,&local_68,&local_f8,zBounds,result);
                    fVar9 = (float)local_88._0_4_;
                    if (bVar6) {
                      if (!bVar3) {
                        if (bVar1) goto LAB_00927a24;
                        xBounds0 = local_e8;
                        if (!bVar4) {
                          return bVar5;
                        }
                        goto LAB_00927507;
                      }
                      break;
                    }
                    local_48 = local_48 + searchStep;
                    bVar3 = (float)local_88._0_4_ < local_48;
                  } while (!bVar3);
                }
                local_b8._0_4_ = (float)local_b8._0_4_ + searchStep;
                bVar1 = (float)local_98._0_4_ < (float)local_b8._0_4_;
              } while (!bVar1);
            }
LAB_00927a24:
            local_c8._0_4_ = (float)local_c8._0_4_ + searchStep;
            fVar9 = local_e0->m_data[1];
            bVar4 = fVar9 + searchStep <= (float)local_c8._0_4_;
            xBounds0 = local_e8;
          } while ((float)local_c8._0_4_ < fVar9 + searchStep);
        }
LAB_00927507:
        local_d8._0_4_ = (float)local_d8._0_4_ + searchStep;
        fVar10 = xBounds0->m_data[1] + searchStep;
        bVar5 = (float)local_d8._0_4_ < fVar10;
      } while ((float)local_d8._0_4_ < fVar10);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

static bool is2DTrilinearFilterResultValid (const LookupPrecision&	prec,
											const ColorQuad&		quad0,
											const ColorQuad&		quad1,
											const Vec2&				xBounds0,
											const Vec2&				yBounds0,
											const Vec2&				xBounds1,
											const Vec2&				yBounds1,
											const Vec2&				zBounds,
											const float				searchStep,
											const Vec4&				result)
{
	DE_ASSERT(xBounds0.x() <= xBounds0.y());
	DE_ASSERT(yBounds0.x() <= yBounds0.y());
	DE_ASSERT(xBounds1.x() <= xBounds1.y());
	DE_ASSERT(yBounds1.x() <= yBounds1.y());
	DE_ASSERT(xBounds0.x() + searchStep > xBounds0.x()); // step is not effectively 0
	DE_ASSERT(xBounds0.y() + searchStep > xBounds0.y());
	DE_ASSERT(yBounds0.x() + searchStep > yBounds0.x());
	DE_ASSERT(yBounds0.y() + searchStep > yBounds0.y());
	DE_ASSERT(xBounds1.x() + searchStep > xBounds1.x());
	DE_ASSERT(xBounds1.y() + searchStep > xBounds1.y());
	DE_ASSERT(yBounds1.x() + searchStep > yBounds1.x());
	DE_ASSERT(yBounds1.y() + searchStep > yBounds1.y());

	if (!isInColorBounds(prec, quad0, quad1, result))
		return false;

	for (float x0 = xBounds0.x(); x0 < xBounds0.y()+searchStep; x0 += searchStep)
	{
		for (float y0 = yBounds0.x(); y0 < yBounds0.y()+searchStep; y0 += searchStep)
		{
			const float		a0	= de::min(x0, xBounds0.y());
			const float		b0	= de::min(y0, yBounds0.y());
			const Vec4		c0	= quad0.p00*(1.0f-a0)*(1.0f-b0) + quad0.p10*a0*(1.0f-b0) + quad0.p01*(1.0f-a0)*b0 + quad0.p11*a0*b0;

			for (float x1 = xBounds1.x(); x1 <= xBounds1.y(); x1 += searchStep)
			{
				for (float y1 = yBounds1.x(); y1 <= yBounds1.y(); y1 += searchStep)
				{
					const float		a1	= de::min(x1, xBounds1.y());
					const float		b1	= de::min(y1, yBounds1.y());
					const Vec4		c1	= quad1.p00*(1.0f-a1)*(1.0f-b1) + quad1.p10*a1*(1.0f-b1) + quad1.p01*(1.0f-a1)*b1 + quad1.p11*a1*b1;

					if (isLinearRangeValid(prec, c0, c1, zBounds, result))
						return true;
				}
			}
		}
	}

	return false;
}